

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl-int-reader.hpp
# Opt level: O1

uint64_t yactfr::internal::anon_unknown_0::readFlUIntLe37At3(uint8_t *buf)

{
  return (ulong)(*buf >> 3) |
         (ulong)buf[1] << 5 |
         ((ulong)buf[2] | (ulong)((uint)buf[3] << 8 | (uint)buf[4] << 0x10)) << 0xd;
}

Assistant:

std::uint64_t readFlUIntLe37At3(const std::uint8_t * const buf) {
    std::uint64_t res = 0;

    res |= buf[4];
    res <<= 8;
    res |= buf[3];
    res <<= 8;
    res |= buf[2];
    res <<= 8;
    res |= buf[1];
    res <<= 5;
    res |= (buf[0] >> 3);
    res &= UINT64_C(0x1fffffffff);
    return res;
}